

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input.cpp
# Opt level: O1

void handleKey(GLFWwindow *window,int key,int scancode,int action,int mode)

{
  bool bVar1;
  
  if ((uint)key < 0x15d) {
    if (action == 1) {
      bVar1 = true;
    }
    else {
      if (action != 0) goto LAB_0014596a;
      bVar1 = false;
    }
    _keys[(uint)key] = bVar1;
  }
LAB_0014596a:
  if (action == 1 && key == 0x100) {
    glfwSetWindowShouldClose(window,1);
    return;
  }
  return;
}

Assistant:

void handleKey(GLFWwindow* window, int key, int scancode, int action, int mode) {
	if (key >= 0 && key <= GLFW_KEY_LAST){
		if (action == GLFW_PRESS){
			_keys[key] = true;
		}else if (action == GLFW_RELEASE){
			_keys[key] = false;
		}
	}

	// exit on ESC
	if (key == GLFW_KEY_ESCAPE && action == GLFW_PRESS) {
		glfwSetWindowShouldClose(window, GL_TRUE);
	}
}